

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

bool __thiscall
QGraphicsScenePrivate::itemAcceptsHoverEvents_helper
          (QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  QGraphicsWidgetPrivate *this_00;
  bool bVar1;
  uint uVar2;
  
  this_00 = (QGraphicsWidgetPrivate *)(item->d_ptr).d;
  uVar2 = (uint)*(undefined8 *)&(this_00->super_QGraphicsItemPrivate).field_0x160;
  if ((uVar2 >> 10 & 1) == 0) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      bVar1 = QGraphicsWidgetPrivate::hasDecoration(this_00);
      if (bVar1) goto LAB_0059b6e4;
    }
    bVar1 = false;
  }
  else {
LAB_0059b6e4:
    bVar1 = QGraphicsItem::isBlockedByModalPanel(item,(QGraphicsItem **)0x0);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool QGraphicsScenePrivate::itemAcceptsHoverEvents_helper(const QGraphicsItem *item) const
{
    return (item->d_ptr->acceptsHover
            || (item->d_ptr->isWidget
                && static_cast<const QGraphicsWidget *>(item)->d_func()->hasDecoration()))
           && !item->isBlockedByModalPanel();
}